

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O3

void run_1D_fdtd(fdtd1D *fdtd,float_type end_time,_Bool verbose)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uintmax_t uVar5;
  float_type *pfVar6;
  float_type *pfVar7;
  float_type *pfVar8;
  bool bVar9;
  uint uVar10;
  long val;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  float_type fVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double divide;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  time_measure tstart_chunk;
  time_measure tend_chunk;
  double local_80;
  timespec local_68;
  double local_50;
  long local_48;
  timespec local_40;
  
  auVar19._0_8_ = (end_time - fdtd->time) / fdtd->dt;
  auVar19._8_8_ = 0;
  auVar19 = vroundsd_avx(auVar19,auVar19,10);
  dVar17 = auVar19._0_8_;
  if (10.0 <= dVar17) {
    auVar25 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    do {
      auVar26._0_8_ = dVar17 / auVar25._0_8_;
      auVar26._8_8_ = auVar19._8_8_;
      auVar25 = ZEXT864((ulong)(auVar25._0_8_ + 1.0));
      auVar26 = vroundsd_avx(auVar26,auVar26,10);
      dVar18 = auVar26._0_8_;
    } while (dVar17 / dVar18 < 10.0);
  }
  else {
    dVar18 = 1.0;
  }
  clock_gettime(4,&local_68);
  if (fdtd->time < end_time) {
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar18;
    lVar12 = 0;
    local_48 = vcvttsd2usi_avx512f(auVar20);
    lVar1 = local_48 + -1;
    local_80 = 100.0 / (dVar17 / dVar18);
    dVar17 = fdtd->dt;
    local_50 = local_80;
    do {
      uVar5 = fdtd->sizeX;
      if (uVar5 != 1) {
        dVar18 = fdtd->dx;
        pfVar6 = fdtd->ez;
        pfVar7 = fdtd->hy;
        pfVar8 = fdtd->permeability_inv;
        lVar13 = 0;
        do {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = pfVar8[lVar13];
          lVar2 = lVar13 + 1;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pfVar7[lVar13];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = (dVar17 / dVar18) * (pfVar6[lVar13 + 1] - pfVar6[lVar13]);
          auVar19 = vfmadd213sd_fma(auVar23,auVar21,auVar3);
          pfVar7[lVar13] = auVar19._0_8_;
          lVar13 = lVar2;
        } while (uVar5 - 1 != lVar2);
      }
      uVar10 = fdtd->num_Msources;
      if (uVar10 != 0) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          if (*(int *)((long)&fdtd->Msources->type + lVar13) == 0) {
            fVar16 = gaussian_pulse_val(fdtd->time,
                                        (fdtd_source *)((long)&fdtd->Msources->type + lVar13));
            fdtd->hy[fdtd->MsourceLocations[uVar14]] =
                 fVar16 + fdtd->hy[fdtd->MsourceLocations[uVar14]];
            uVar10 = fdtd->num_Msources;
          }
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar14 < uVar10);
      }
      lVar13 = 0;
      bVar15 = true;
      do {
        bVar9 = bVar15;
        if (fdtd->border_condition[lVar13] == border_perfect_magnetic_conductor) {
          fdtd->hy[(fdtd->sizeX - 1) * lVar13] = 0.0;
        }
        lVar13 = 1;
        bVar15 = false;
      } while (bVar9);
      uVar14 = fdtd->sizeX;
      if (1 < uVar14) {
        dVar17 = fdtd->dt;
        pfVar6 = fdtd->ez;
        pfVar7 = fdtd->hy;
        pfVar8 = fdtd->permittivity_inv;
        uVar11 = 1;
        dVar18 = fdtd->dx;
        do {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = pfVar8[uVar11];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = pfVar6[uVar11];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = (dVar17 / dVar18) * (pfVar7[uVar11] - pfVar7[uVar11 - 1]);
          auVar19 = vfmadd213sd_fma(auVar24,auVar22,auVar4);
          pfVar6[uVar11] = auVar19._0_8_;
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      uVar10 = fdtd->num_Jsources;
      if (uVar10 != 0) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          if (*(int *)((long)&fdtd->Jsources->type + lVar13) == 0) {
            fVar16 = gaussian_pulse_val(fdtd->time,
                                        (fdtd_source *)((long)&fdtd->Jsources->type + lVar13));
            fdtd->ez[fdtd->JsourceLocations[uVar14]] =
                 fVar16 + fdtd->ez[fdtd->JsourceLocations[uVar14]];
            uVar10 = fdtd->num_Jsources;
          }
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar14 < uVar10);
      }
      lVar13 = 0;
      bVar15 = true;
      do {
        bVar9 = bVar15;
        if (fdtd->border_condition[lVar13] == border_perfect_electric_conductor) {
          fdtd->ez[(fdtd->sizeX - 1) * lVar13] = 0.0;
        }
        lVar13 = 1;
        bVar15 = false;
      } while (bVar9);
      lVar13 = lVar12 + 1;
      bVar15 = lVar12 != lVar1;
      lVar12 = 0;
      if (bVar15) {
        lVar12 = lVar13;
      }
      if ((verbose) && (lVar12 == 0)) {
        clock_gettime(4,&local_40);
        if (local_40.tv_nsec < local_68.tv_nsec) {
          dVar17 = (double)((local_40.tv_nsec - local_68.tv_nsec) + 1000000000) / 1000000000.0 +
                   -1.0;
        }
        else {
          dVar17 = (double)(local_40.tv_nsec - local_68.tv_nsec) / 1000000000.0;
        }
        dVar18 = difftime(local_40.tv_sec,local_68.tv_sec);
        printf("%.0f%% -- t=%e dt=%e tend=%e (%zu iter in %.3fs)\n",local_80,fdtd->time,fdtd->dt,
               end_time,dVar18 + dVar17,local_48);
        local_80 = local_80 + local_50;
        local_68.tv_sec = local_40.tv_sec;
        local_68.tv_nsec = local_40.tv_nsec;
      }
      dVar17 = fdtd->dt;
      dVar18 = dVar17 + fdtd->time;
      fdtd->time = dVar18;
    } while (dVar18 < end_time);
  }
  return;
}

Assistant:

void run_1D_fdtd(struct fdtd1D *fdtd, float_type end_time, bool verbose) {
  const double num_iter_d = ceil((end_time - fdtd->time) / fdtd->dt);
  double print_interval_d;
  if (num_iter_d >= 10.) {
    double divide = 1.;
    do {
      print_interval_d = ceil(num_iter_d / divide);
      divide = divide + 1.;
    } while (num_iter_d / print_interval_d < 10.);
  } else {
    print_interval_d = 1.;
  }
  const size_t print_interval = (size_t)print_interval_d;
  const double percent_increment = 100. / (num_iter_d / print_interval_d);
  const size_t inter_print = print_interval - 1;
  size_t iter_count = 0;
  double percentage = percent_increment;
  time_measure tstart_chunk, tend_chunk;
  get_current_time(&tstart_chunk);
  for (; fdtd->time < end_time; fdtd->time += fdtd->dt) {
    update_magnetic_field(fdtd);
    apply_M_sources(fdtd);
    border_condition_magnetic(fdtd);

    update_electric_field(fdtd);
    apply_J_sources(fdtd);
    border_condition_electric(fdtd);

    iter_count = iter_count == inter_print ? 0 : iter_count + 1;
    if (verbose && iter_count == 0) {
      get_current_time(&tend_chunk);
      double difference = measuring_difftime(tstart_chunk, tend_chunk);
      printf("%.0f%% -- t=%e dt=%e tend=%e (%zu iter in %.3fs)\n", percentage,
             fdtd->time, fdtd->dt, end_time, print_interval, difference);
      percentage += percent_increment;
      tstart_chunk = tend_chunk;
    }
  }
}